

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

void Id_DsdManTuneStr(If_DsdMan_t *p,char *pStruct,int nConfls,int nProcs,int fVerbose)

{
  uint *puVar1;
  void *__ptr;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Ifn_Ntk_t *pIVar8;
  size_t sVar9;
  char *__dest;
  long lVar10;
  Vec_Wrd_t *pVVar11;
  word *__s;
  ProgressBar *p_00;
  ulong uVar12;
  long lVar13;
  If_DsdMan_t *extraout_RDX;
  If_DsdMan_t *extraout_RDX_00;
  If_DsdMan_t *Fill;
  long lVar14;
  long lVar15;
  timespec *__tp;
  pthread_t *__newthread;
  long lVar16;
  ulong uVar17;
  long *plVar18;
  timespec ts_1;
  pthread_t WorkerThread [100];
  timespec ts;
  timespec local_fa48;
  pthread_t local_fa38 [100];
  timespec local_f718 [32];
  undefined1 auStack_f510 [84];
  uint local_f4bc [3];
  undefined8 local_f4b0;
  long local_f4a8 [7823];
  
  __tp = local_f718;
  iVar3 = clock_gettime(3,__tp);
  if (iVar3 < 0) {
    lVar13 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_f718[0].tv_nsec),8);
    lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_f718[0].tv_sec * -1000000;
  }
  if (nProcs == 1) {
    Id_DsdManTuneStr1(p,pStruct,nConfls,fVerbose);
  }
  else if (nProcs < 0x65) {
    pIVar8 = Ifn_NtkParse(pStruct);
    if (pIVar8 != (Ifn_Ntk_t *)0x0) {
      iVar3 = p->nVars;
      iVar4 = Ifn_NtkInputNum(pIVar8);
      if (iVar4 < iVar3) {
        uVar6 = p->nVars;
        uVar5 = Ifn_NtkInputNum(pIVar8);
        printf("The support of DSD manager (%d) exceeds the support of the structure (%d).\n",
               (ulong)uVar6,(ulong)uVar5);
        free(pIVar8);
      }
      else {
        if (p->pCellStr != (char *)0x0) {
          free(p->pCellStr);
          p->pCellStr = (char *)0x0;
        }
        if (pStruct == (char *)0x0) {
          __dest = (char *)0x0;
        }
        else {
          sVar9 = strlen(pStruct);
          __dest = (char *)malloc(sVar9 + 1);
          strcpy(__dest,pStruct);
        }
        p->pCellStr = __dest;
        iVar3 = p->nVars;
        iVar4 = Ifn_NtkInputNum(pIVar8);
        if (iVar3 < iVar4) {
          uVar6 = p->nVars;
          uVar5 = Ifn_NtkInputNum(pIVar8);
          printf("Warning: The support of DSD manager (%d) is less than the support of the structure (%d).\n"
                 ,(ulong)uVar6,(ulong)uVar5);
        }
        uVar6 = Ifn_NtkLutSizeMax(pIVar8);
        uVar5 = Ifn_NtkTtBits(pStruct);
        p->nTtBits = uVar5;
        iVar3 = (((int)uVar5 >> 6) + 1) - (uint)((uVar5 & 0x3f) == 0);
        p->nConfigWords = iVar3 + 1;
        if (9 < iVar3) {
          __assert_fail("p->nConfigWords <= 10",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                        ,0xa4f,"void Id_DsdManTuneStr(If_DsdMan_t *, char *, int, int, int)");
        }
        if (fVerbose != 0) {
          printf("Considering programmable cell: ");
          Ifn_NtkPrint(pIVar8);
          printf("Largest LUT size = %d.\n",(ulong)uVar6);
        }
        free(pIVar8);
        Fill = extraout_RDX;
        if (0 < p->nObjsPrev) {
          printf("Starting the tuning process from object %d (out of %d).\n",
                 (ulong)(uint)p->nObjsPrev,(ulong)(uint)(p->vObjs).nSize);
          Fill = extraout_RDX_00;
        }
        iVar3 = (p->vObjs).nSize;
        if (0 < iVar3) {
          lVar10 = 0;
          do {
            if (p->nObjsPrev <= lVar10) {
              puVar1 = (uint *)((long)(p->vObjs).pArray[lVar10] + 4);
              *puVar1 = *puVar1 & 0xfffffeff;
              iVar3 = (p->vObjs).nSize;
            }
            lVar10 = lVar10 + 1;
            Fill = p;
          } while (lVar10 < iVar3);
        }
        lVar10 = (long)iVar3 * (long)p->nConfigWords;
        iVar4 = (int)lVar10;
        if (p->vConfigs == (Vec_Wrd_t *)0x0) {
          pVVar11 = (Vec_Wrd_t *)malloc(0x10);
          iVar7 = 0x10;
          if (0xe < iVar4 - 1U) {
            iVar7 = iVar4;
          }
          pVVar11->nCap = iVar7;
          if (iVar7 == 0) {
            __s = (word *)0x0;
          }
          else {
            __s = (word *)malloc((long)iVar7 << 3);
          }
          pVVar11->pArray = __s;
          pVVar11->nSize = iVar4;
          memset(__s,0,lVar10 * 8);
          p->vConfigs = pVVar11;
        }
        else {
          Vec_WrdFillExtra(p->vConfigs,iVar4,(word)Fill);
          iVar3 = (p->vObjs).nSize;
        }
        p_00 = Extra_ProgressBarStart(_stdout,iVar3);
        uVar6 = p->nObjsPrev;
        uVar12 = (ulong)(uint)nProcs;
        if (0 < nProcs) {
          __newthread = local_fa38;
          uVar17 = uVar12;
          do {
            pIVar8 = Ifn_NtkParse(pStruct);
            __tp->tv_sec = (__time_t)pIVar8;
            *(undefined8 *)((long)&__tp[0x25].tv_nsec + 4) = 0xffffffffffffffff;
            *(int *)((long)&__tp[0x26].tv_sec + 4) = nConfls;
            __tp[0x26].tv_nsec = 0xffffffff;
            __tp[0x27].tv_sec = 0;
            *(int *)&__tp[0x25].tv_nsec = p->nConfigWords;
            iVar3 = pthread_create(__newthread,(pthread_attr_t *)0x0,Ifn_WorkerThread,__tp);
            if (iVar3 != 0) {
              __assert_fail("status == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                            ,0xa74,"void Id_DsdManTuneStr(If_DsdMan_t *, char *, int, int, int)");
            }
            __newthread = __newthread + 1;
            __tp = (timespec *)&__tp[0x27].tv_nsec;
            uVar17 = uVar17 - 1;
          } while (uVar17 != 0);
        }
        bVar2 = true;
        lVar10 = 0;
        while ((bVar2 || ((int)uVar6 < (p->vObjs).nSize))) {
          bVar2 = false;
          if (0 < nProcs) {
            lVar16 = 0;
            do {
              if (*(int *)((long)local_f4a8 + lVar16 + -4) == 0) {
                iVar3 = *(int *)((long)local_f4bc + lVar16 + 4);
                if (-1 < (long)iVar3) {
                  if (1 < *(uint *)((long)&local_f4b0 + lVar16)) {
                    __assert_fail("ThData[i].Result == 0 || ThData[i].Result == 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                                  ,0xa81,
                                  "void Id_DsdManTuneStr(If_DsdMan_t *, char *, int, int, int)");
                  }
                  if (*(uint *)((long)&local_f4b0 + lVar16) == 0) {
                    if ((p->vObjs).nSize <= iVar3) goto LAB_0042fa85;
                    puVar1 = (uint *)((long)(p->vObjs).pArray[iVar3] + 4);
                    *puVar1 = *puVar1 | 0x100;
                  }
                  else {
                    uVar5 = iVar3 * p->nConfigWords;
                    if (((int)uVar5 < 0) || (p->vConfigs->nSize <= (int)uVar5)) {
                      __assert_fail("i >= 0 && i < p->nSize",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                                    ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
                    }
                    memcpy(p->vConfigs->pArray + uVar5,auStack_f510 + lVar16,
                           (long)p->nConfigWords << 3);
                  }
                  *(undefined4 *)((long)local_f4bc + lVar16 + 4) = 0xffffffff;
                  *(undefined4 *)((long)&local_f4b0 + lVar16) = 0xffffffff;
                }
                if ((int)uVar6 < (p->vObjs).nSize) {
                  if (((char)uVar6 == '\0') &&
                     ((p_00 == (ProgressBar *)0x0 || (p_00->nItemsNext <= (int)uVar6)))) {
                    Extra_ProgressBarUpdate_int(p_00,uVar6,(char *)0x0);
                  }
                  if (((int)uVar6 < 0) || ((p->vObjs).nSize <= (int)uVar6)) {
LAB_0042fa85:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                  }
                  uVar5 = *(uint *)((long)(p->vObjs).pArray[uVar6] + 4);
                  iVar3 = clock_gettime(3,&local_fa48);
                  if (iVar3 < 0) {
                    lVar14 = 1;
                  }
                  else {
                    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_fa48.tv_nsec),8);
                    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_fa48.tv_sec * -1000000;
                  }
                  If_DsdManComputeTruthPtr
                            (p,uVar6 * 2,(uchar *)0x0,
                             (word *)((long)&local_f718[0].tv_nsec + lVar16));
                  iVar3 = clock_gettime(3,&local_fa48);
                  if (iVar3 < 0) {
                    lVar15 = -1;
                  }
                  else {
                    lVar15 = local_fa48.tv_nsec / 1000 + local_fa48.tv_sec * 1000000;
                  }
                  lVar10 = lVar14 + lVar10 + lVar15;
                  *(uint *)((long)local_f4bc + lVar16) = uVar5 >> 3 & 0x1f;
                  *(uint *)((long)local_f4bc + lVar16 + 4) = uVar6;
                  *(undefined8 *)((long)&local_f4b0 + lVar16) = 0x1ffffffff;
                  uVar6 = uVar6 + 1;
                }
              }
              bVar2 = false;
              lVar16 = lVar16 + 0x278;
            } while (uVar12 * 0x278 - lVar16 != 0);
            if (0 < nProcs) {
              lVar16 = 0;
              bVar2 = false;
              do {
                iVar3 = *(int *)((long)local_f4a8 + lVar16 + -4);
                if ((iVar3 == 1) || ((iVar3 == 0 && (-1 < *(int *)((long)local_f4bc + lVar16 + 4))))
                   ) {
                  bVar2 = true;
                }
                lVar16 = lVar16 + 0x278;
              } while (uVar12 * 0x278 - lVar16 != 0);
            }
          }
        }
        if (0 < nProcs) {
          lVar16 = 0;
          do {
            if (*(int *)((long)local_f4a8 + lVar16 + -4) != 0) {
              __assert_fail("ThData[i].Status == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                            ,0xaa9,"void Id_DsdManTuneStr(If_DsdMan_t *, char *, int, int, int)");
            }
            *(undefined4 *)((long)local_f4bc + lVar16 + 4) = 0xffffffff;
            *(undefined4 *)((long)local_f4a8 + lVar16 + -4) = 1;
            __ptr = *(void **)((long)&local_f718[0].tv_sec + lVar16);
            if (__ptr != (void *)0x0) {
              free(__ptr);
              *(undefined8 *)((long)&local_f718[0].tv_sec + lVar16) = 0;
            }
            lVar16 = lVar16 + 0x278;
          } while (uVar12 * 0x278 - lVar16 != 0);
        }
        if (fVerbose != 0) {
          iVar3 = 0x9ce8ec;
          printf("Main     : ");
          Abc_Print(iVar3,"%s =","Time");
          Abc_Print(iVar3,"%9.2f sec\n",(double)lVar10 / 1000000.0);
          if (0 < nProcs) {
            plVar18 = local_f4a8;
            uVar17 = 0;
            do {
              iVar3 = 0x9ce8f8;
              printf("Thread %d : ",uVar17 & 0xffffffff);
              lVar10 = *plVar18;
              Abc_Print(iVar3,"%s =","Time");
              Abc_Print(iVar3,"%9.2f sec\n",(double)lVar10 / 1000000.0);
              uVar17 = uVar17 + 1;
              plVar18 = plVar18 + 0x4f;
            } while (uVar12 != uVar17);
          }
        }
        p->nObjsPrev = 0;
        p->LutSize = 0;
        Extra_ProgressBarStop(p_00);
        printf("Finished matching %d functions. ",(ulong)(uint)(p->vObjs).nSize);
        iVar4 = 3;
        iVar3 = clock_gettime(3,local_f718);
        if (iVar3 < 0) {
          lVar10 = -1;
        }
        else {
          lVar10 = local_f718[0].tv_nsec / 1000 + local_f718[0].tv_sec * 1000000;
        }
        Abc_Print(iVar4,"%s =","Time");
        Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar10 + lVar13) / 1000000.0);
      }
    }
  }
  else {
    printf("The number of processes (%d) exceeds the precompiled limit (%d).\n",(ulong)(uint)nProcs,
           100);
  }
  return;
}

Assistant:

void Id_DsdManTuneStr( If_DsdMan_t * p, char * pStruct, int nConfls, int nProcs, int fVerbose )
{
    int fVeryVerbose = 0;
    ProgressBar * pProgress = NULL;
    int i, k, nVars, LutSize;
    abctime clk = Abc_Clock();
    Ifn_Ntk_t * pNtk;
    If_DsdObj_t * pObj;
    if ( nProcs == 1 )
    {
        Id_DsdManTuneStr1( p, pStruct, nConfls, fVerbose );
        return;
    }
    if ( nProcs > PAR_THR_MAX )
    {
        printf( "The number of processes (%d) exceeds the precompiled limit (%d).\n", nProcs, PAR_THR_MAX );
        return;
    }
    // parse the structure
    pNtk = Ifn_NtkParse( pStruct );
    if ( pNtk == NULL )
        return;
    if ( If_DsdManVarNum(p) > Ifn_NtkInputNum(pNtk) )
    {
        printf( "The support of DSD manager (%d) exceeds the support of the structure (%d).\n", If_DsdManVarNum(p), Ifn_NtkInputNum(pNtk) );
        ABC_FREE( pNtk );
        return;
    }
    ABC_FREE( p->pCellStr );
    p->pCellStr = Abc_UtilStrsav( pStruct );
    if ( If_DsdManVarNum(p) < Ifn_NtkInputNum(pNtk) )
        printf( "Warning: The support of DSD manager (%d) is less than the support of the structure (%d).\n", If_DsdManVarNum(p), Ifn_NtkInputNum(pNtk) );
    // check the largest LUT
    LutSize = Ifn_NtkLutSizeMax(pNtk);
    p->nTtBits = Ifn_NtkTtBits( pStruct );
    p->nConfigWords = 1 + Abc_Bit6WordNum( p->nTtBits );
    assert( p->nConfigWords <= 10 );
    if ( fVerbose )
    {
        printf( "Considering programmable cell: " );
        Ifn_NtkPrint( pNtk );
        printf( "Largest LUT size = %d.\n", LutSize );
    }
    ABC_FREE( pNtk );
    if ( p->nObjsPrev > 0 )
        printf( "Starting the tuning process from object %d (out of %d).\n", p->nObjsPrev, Vec_PtrSize(&p->vObjs) );
    // clean the attributes
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
        if ( i >= p->nObjsPrev )
            pObj->fMark = 0;
    if ( p->vConfigs == NULL )
        p->vConfigs = Vec_WrdStart( p->nConfigWords * Vec_PtrSize(&p->vObjs) );
    else
        Vec_WrdFillExtra( p->vConfigs, p->nConfigWords * Vec_PtrSize(&p->vObjs), 0 );
    pProgress = Extra_ProgressBarStart( stdout, Vec_PtrSize(&p->vObjs) );

    // perform concurrent solving
    {
        pthread_t WorkerThread[PAR_THR_MAX];
        Ifn_ThData_t ThData[PAR_THR_MAX];
        abctime clk, clkUsed = 0;
        int status, fRunning = 1, iCurrentObj = p->nObjsPrev;
        // start the threads
        for ( i = 0; i < nProcs; i++ )
        {
            ThData[i].pNtk     = Ifn_NtkParse( pStruct );
            ThData[i].nVars    = -1;      // support
            ThData[i].Id       = -1;      // object
            ThData[i].nConfls  = nConfls; // conflicts
            ThData[i].Result   = -1;      // result
            ThData[i].Status   =  0;      // state
            ThData[i].clkUsed  =  0;      // total runtime
            ThData[i].nConfigWords = p->nConfigWords;
            status = pthread_create( WorkerThread + i, NULL, Ifn_WorkerThread, (void *)(ThData + i) );  assert( status == 0 );
        }
        // run the threads
        while ( fRunning || iCurrentObj < Vec_PtrSize(&p->vObjs) )
        {
            for ( i = 0; i < nProcs; i++ )
            {
                if ( ThData[i].Status )
                    continue;
                assert( ThData[i].Status == 0 );
                if ( ThData[i].Id >= 0 )
                {
                    //printf( "Closing obj %d with Thread %d:\n", ThData[i].Id, i );
                    assert( ThData[i].Result == 0 || ThData[i].Result == 1 );
                    if ( ThData[i].Result == 0 )
                        If_DsdVecObjSetMark( &p->vObjs, ThData[i].Id );
                    else
                    {
                        word * pTtWords = Vec_WrdEntryP( p->vConfigs, p->nConfigWords * ThData[i].Id );
                        memcpy( pTtWords, ThData[i].pConfig, sizeof(word) * p->nConfigWords );
                    }
                    ThData[i].Id     = -1;
                    ThData[i].Result = -1;
                }
                for ( k = iCurrentObj; k < Vec_PtrSize(&p->vObjs); k++ )
                {
                    if ( (k & 0xFF) == 0 )
                        Extra_ProgressBarUpdate( pProgress, k, NULL );
                    pObj  = If_DsdVecObj( &p->vObjs, k );
                    nVars = If_DsdObjSuppSize(pObj);
                    //if ( nVars <= LutSize )
                    //    continue;
                    clk = Abc_Clock();
                    If_DsdManComputeTruthPtr( p, Abc_Var2Lit(k, 0), NULL, ThData[i].pTruth );
                    clkUsed += Abc_Clock() - clk;
                    ThData[i].nVars  = nVars;
                    ThData[i].Id     =  k;
                    ThData[i].Result = -1;
                    ThData[i].Status =  1;
                    //printf( "Scheduling %d for Thread %d\n", ThData[i].Id, i );
                    iCurrentObj = k+1;
                    break;
                }
            }
            fRunning = 0;
            for ( i = 0; i < nProcs; i++ )
                if ( ThData[i].Status == 1 || (ThData[i].Status == 0 && ThData[i].Id >= 0) )
                    fRunning = 1;
            //printf( "fRunning %d\n", fRunning );
        }
        // stop the threads
        for ( i = 0; i < nProcs; i++ )
        {
            assert( ThData[i].Status == 0 );
            ThData[i].Id = -1;
            ThData[i].Status = 1;
            ABC_FREE( ThData[i].pNtk );
        }
        if ( fVerbose )
        {
            printf( "Main     : " );
            Abc_PrintTime( 1, "Time", clkUsed );
            for ( i = 0; i < nProcs; i++ )
            {
                printf( "Thread %d : ", i );
                Abc_PrintTime( 1, "Time", ThData[i].clkUsed );
            }
        }
    }

    p->nObjsPrev = 0;
    p->LutSize = 0;
    Extra_ProgressBarStop( pProgress );
    printf( "Finished matching %d functions. ", Vec_PtrSize(&p->vObjs) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVeryVerbose )
        If_DsdManPrintDistrib( p );
}